

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxReturnStatement::Resolve(FxReturnStatement *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxTypeCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PPrototype *proto;
  TArray<PType_*,_PType_*> none;
  TArray<PType_*,_PType_*> local_28;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar2 = this->Value;
  if (pFVar2 == (FxExpression *)0x0) {
    local_28.Most = 0;
    local_28.Count = 0;
    local_28.Array =
         (PType **)
         M_Malloc_Dbg(0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                      ,0x8c);
    proto = NewPrototype(&local_28,&local_28);
    TArray<PType_*,_PType_*>::~TArray(&local_28);
  }
  else {
    iVar1 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Value = pFVar2;
    if (pFVar2 == (FxExpression *)0x0) {
LAB_00538816:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    if (((ctx->ReturnProto != (PPrototype *)0x0) && ((ctx->ReturnProto->ReturnTypes).Count != 0)) &&
       (*(int *)&(ctx->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 != 0)) {
      this_00 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast(this_00,this->Value,*(ctx->ReturnProto->ReturnTypes).Array,false,false)
      ;
      this->Value = (FxExpression *)this_00;
      iVar1 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
      pFVar2 = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
      this->Value = pFVar2;
      if (pFVar2 == (FxExpression *)0x0) goto LAB_00538816;
    }
    iVar1 = (*pFVar2->_vptr_FxExpression[5])(pFVar2);
    proto = (PPrototype *)CONCAT44(extraout_var_01,iVar1);
  }
  FCompileContext::CheckReturn(ctx,proto,&(this->super_FxExpression).ScriptPosition);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxReturnStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Value, ctx);

	PPrototype *retproto;
	if (Value == nullptr)
	{
		TArray<PType *> none(0);
		retproto = NewPrototype(none, none);
	}
	else
	{
		// If we already know the real return type we need at least try to cast the value to its proper type (unless in an anonymous function.)
		if (ctx.ReturnProto != nullptr && ctx.ReturnProto->ReturnTypes.Size() > 0 && ctx.Function->SymbolName != NAME_None)
		{
			Value = new FxTypeCast(Value, ctx.ReturnProto->ReturnTypes[0], false, false);
			Value = Value->Resolve(ctx);
			ABORT(Value);
		}
		retproto = Value->ReturnProto();
	}

	ctx.CheckReturn(retproto, ScriptPosition);

	return this;
}